

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secretbox.h
# Opt level: O0

void hydro_secretbox_probe_create(uint8_t *probe,uint8_t *c,size_t c_len,char *ctx,uint8_t *key)

{
  ulong in_RDX;
  uint8_t *unaff_retaddr;
  uint8_t *mac;
  
  if (in_RDX < 0x24) {
    abort();
  }
  hydro_hash_hash(c,c_len,ctx,(size_t)key,(char *)mac,unaff_retaddr);
  return;
}

Assistant:

void
hydro_secretbox_probe_create(uint8_t probe[hydro_secretbox_PROBEBYTES], const uint8_t *c,
                             size_t c_len, const char ctx[hydro_secretbox_CONTEXTBYTES],
                             const uint8_t key[hydro_secretbox_KEYBYTES])
{
    const uint8_t *mac;

    if (c_len < hydro_secretbox_HEADERBYTES) {
        abort();
    }
    mac = &c[hydro_secretbox_SIVBYTES];
    COMPILER_ASSERT(hydro_secretbox_CONTEXTBYTES >= hydro_hash_CONTEXTBYTES);
    COMPILER_ASSERT(hydro_secretbox_KEYBYTES >= hydro_hash_KEYBYTES);
    hydro_hash_hash(probe, hydro_secretbox_PROBEBYTES, mac, hydro_secretbox_MACBYTES, ctx, key);
}